

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesGenerator.cxx
# Opt level: O2

string * __thiscall
cmInstallFilesGenerator::GetDestination
          (string *__return_storage_ptr__,cmInstallFilesGenerator *this,string *config)

{
  char *pcVar1;
  cmGeneratorExpression ge;
  allocator local_69;
  undefined1 local_68 [8];
  undefined1 local_60 [32];
  string local_40;
  
  cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)local_60);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&local_40,(cmListFileBacktrace *)local_60);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)local_60);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_68,&local_40);
  local_60._0_8_ = local_60 + 0x10;
  local_60._8_8_ = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x0;
  local_60[0x10] = '\0';
  pcVar1 = cmCompiledGeneratorExpression::Evaluate
                     ((cmCompiledGeneratorExpression *)local_68,this->LocalGenerator,config,false,
                      (cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                      (cmGeneratorExpressionDAGChecker *)0x0,(string *)local_60);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_69);
  std::__cxx11::string::~string((string *)local_60);
  cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_68);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallFilesGenerator::GetDestination(
  std::string const& config) const
{
  cmGeneratorExpression ge;
  return ge.Parse(this->Destination)->Evaluate(this->LocalGenerator, config);
}